

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O1

bool __thiscall
cmExportCommand::InitialPass
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  cmCommand *pcVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  TargetType TVar6;
  undefined8 *puVar7;
  ostream *poVar8;
  string *psVar9;
  cmGlobalGenerator *this_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  cmTarget *this_01;
  cmExportBuildFileGenerator *pcVar11;
  iterator iVar12;
  string *ct;
  pointer pbVar13;
  undefined1 auVar14 [8];
  _Rb_tree_header *p_Var15;
  _Alloc_hider _Var16;
  pointer pbVar17;
  cmExportSet *exportSet;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>_>,_bool>
  pVar18;
  static_string_view name;
  static_string_view name_00;
  string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  string_view arg;
  string fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keywordsMissingValue;
  cmArgumentParser<Arguments> parser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  Arguments arguments;
  undefined1 local_328 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  undefined1 local_2e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2c8;
  cmCommand *local_2c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  undefined1 local_2a0 [24];
  undefined1 local_288 [8];
  string *psStack_280;
  string local_278 [3];
  ios_base local_218 [272];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  string local_98;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined2 local_58;
  string local_50;
  
  pbVar13 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13) < 0x21) {
    local_288 = (undefined1  [8])local_278;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_2a0 + 0x18),"called with too few arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)(local_2a0 + 0x18));
    if (local_288 != (undefined1  [8])local_278) {
      operator_delete((void *)local_288,(ulong)(local_278[0]._M_dataplus._M_p + 1));
    }
    return false;
  }
  iVar5 = std::__cxx11::string::compare((char *)pbVar13);
  if (iVar5 == 0) {
    bVar4 = HandlePackage(this,args);
    return bVar4;
  }
  local_288 = (undefined1  [8])0x0;
  psStack_280 = (string *)0x0;
  local_278[0]._M_dataplus._M_p = (pointer)0x0;
  name.super_string_view._M_str = "NAMESPACE";
  name.super_string_view._M_len = 9;
  cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)(local_2a0 + 0x18),name,0x38);
  name_00.super_string_view._M_str = "FILE";
  name_00.super_string_view._M_len = 4;
  cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)(local_2a0 + 0x18),name_00,0x58);
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
  ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
            *)local_2a0,
           (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
            *)(local_2a0 + 0x18));
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
             *)(local_2a0 + 0x18));
  iVar5 = std::__cxx11::string::compare
                    ((char *)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  local_2c0 = &this->super_cmCommand;
  if (iVar5 == 0) {
    name_05.super_string_view._M_str = "EXPORT";
    name_05.super_string_view._M_len = 6;
    cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_2a0,name_05,0);
  }
  else {
    psStack_280 = (string *)0x0;
    local_288 = (undefined1  [8])0x20;
    local_278[0]._M_string_length =
         (size_type)
         std::
         _Function_handler<void_(ArgumentParser::Instance_&,_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h:71:18)>
         ::_M_invoke;
    local_278[0]._M_dataplus._M_p =
         (pointer)std::
                  _Function_handler<void_(ArgumentParser::Instance_&,_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h:71:18)>
                  ::_M_manager;
    name_01._M_str = "TARGETS";
    name_01._M_len = 7;
    pVar18 = ArgumentParser::ActionMap::Emplace
                       ((ActionMap *)local_2a0,name_01,(Action *)(local_2a0 + 0x18));
    if ((code *)local_278[0]._M_dataplus._M_p != (code *)0x0) {
      (*(code *)local_278[0]._M_dataplus._M_p)(local_2a0 + 0x18,local_2a0 + 0x18,3);
    }
    if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("inserted",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h"
                    ,0x4b,
                    "cmArgumentParser<Result> &cmArgumentParser<Arguments>::Bind(cm::static_string_view, T Result::*) [Result = Arguments, T = std::vector<std::basic_string<char>>]"
                   );
    }
    name_02.super_string_view._M_str = "ANDROID_MK";
    name_02.super_string_view._M_len = 10;
    cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_2a0,name_02,0x78);
    name_03.super_string_view._M_str = "APPEND";
    name_03.super_string_view._M_len = 6;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_2a0,name_03,0x98);
    name_04.super_string_view._M_str = "EXPORT_LINK_INTERFACE_LIBRARIES";
    name_04.super_string_view._M_len = 0x1f;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_2a0,name_04,0x99);
  }
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8 = &local_a8;
  local_b0 = 0;
  local_a8 = 0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  local_58 = 0;
  psStack_280 = (string *)0x0;
  local_278[0]._M_dataplus._M_p = (pointer)0x0;
  local_278[0]._M_string_length = local_278[0]._M_string_length & 0xffffffffffffff00;
  pbVar13 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar17 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_2c8 = args;
  local_288 = (undefined1  [8])local_2a0;
  if (pbVar13 != pbVar17) {
    do {
      arg._M_str = (pbVar13->_M_dataplus)._M_p;
      arg._M_len = pbVar13->_M_string_length;
      ArgumentParser::Instance::Consume
                ((Instance *)(local_2a0 + 0x18),arg,&local_f0,&local_108,&local_2b8);
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != pbVar17);
  }
  lVar3 = local_70;
  pcVar2 = local_2c0;
  if (local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308,
                   "Unknown argument: \"",
                   local_108.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    pcVar2 = local_2c0;
    puVar7 = (undefined8 *)std::__cxx11::string::append(local_308._M_local_buf);
    psVar9 = (string *)(puVar7 + 2);
    if ((string *)*puVar7 == psVar9) {
      local_278[0]._M_dataplus._M_p =
           (pointer)(((_Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                       *)&psVar9->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
      local_278[0]._M_string_length = puVar7[3];
      local_288 = (undefined1  [8])local_278;
    }
    else {
      local_278[0]._M_dataplus._M_p =
           (pointer)(((_Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                       *)&psVar9->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
      local_288 = (undefined1  [8])*puVar7;
    }
    psStack_280 = (string *)puVar7[1];
    *puVar7 = psVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    cmCommand::SetError(pcVar2,(string *)(local_2a0 + 0x18));
    if (local_288 != (undefined1  [8])local_278) {
      operator_delete((void *)local_288,(ulong)(local_278[0]._M_dataplus._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_allocated_capacity != &local_2f8) {
      operator_delete((void *)local_308._M_allocated_capacity,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    bVar4 = false;
    goto LAB_001b0878;
  }
  local_308._M_allocated_capacity = (size_type)&local_2f8;
  local_308._8_8_ = 0;
  local_2f8._M_local_buf[0] = '\0';
  if (local_70 != 0) {
    std::__cxx11::string::_M_assign((string *)local_308._M_local_buf);
  }
  if (local_308._8_8_ == 0 && local_98._M_string_length == 0) {
    iVar5 = std::__cxx11::string::compare
                      ((char *)(local_2c8->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar5 == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_2a0 + 0x18),&local_f0,".cmake");
      std::__cxx11::string::operator=((string *)local_308._M_local_buf,(string *)(local_2a0 + 0x18))
      ;
      if (local_288 != (undefined1  [8])local_278) {
        operator_delete((void *)local_288,(ulong)(local_278[0]._M_dataplus._M_p + 1));
      }
      goto LAB_001b00d3;
    }
    local_288 = (undefined1  [8])local_278;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_2a0 + 0x18),"FILE <filename> option missing.","");
    cmCommand::SetError(pcVar2,(string *)(local_2a0 + 0x18));
    if (local_288 != (undefined1  [8])local_278) {
      operator_delete((void *)local_288,(ulong)(local_278[0]._M_dataplus._M_p + 1));
    }
LAB_001b01a3:
    bVar4 = false;
  }
  else {
    if (local_308._8_8_ == 0) {
      cmsys::SystemTools::GetFilenameLastExtension((string *)(local_2a0 + 0x18),&local_98);
      iVar5 = std::__cxx11::string::compare(local_2a0 + 0x18);
      if (local_288 != (undefined1  [8])local_278) {
        operator_delete((void *)local_288,(ulong)(local_278[0]._M_dataplus._M_p + 1));
      }
      if (iVar5 == 0) {
        std::__cxx11::string::_M_assign((string *)local_308._M_local_buf);
        goto LAB_001b00d3;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2a0 + 0x18));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_2a0 + 0x18),"FILE option given filename \"",0x1c);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_2a0 + 0x18),local_98._M_dataplus._M_p,
                          local_98._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"\" which does not have an extension of \".cmake\".\n",0x30);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(pcVar2,(string *)local_328);
LAB_001b0167:
      if ((string *)local_328._0_8_ != (string *)(local_328 + 0x10)) {
        operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_2a0 + 0x18));
      std::ios_base::~ios_base(local_218);
      goto LAB_001b01a3;
    }
LAB_001b00d3:
    bVar4 = cmsys::SystemTools::FileIsFullPath((string *)&local_308);
    if (bVar4) {
      bVar4 = cmMakefile::CanIWriteThisFile(pcVar2->Makefile,(string *)&local_308);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2a0 + 0x18));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_2a0 + 0x18),"FILE option given filename \"",0x1c);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)(local_2a0 + 0x18),(char *)local_308._M_allocated_capacity,
                            local_308._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"\" which is in the source tree.\n",0x1f);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar2,(string *)local_328);
        goto LAB_001b0167;
      }
    }
    else {
      psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2->Makefile);
      pcVar1 = (psVar9->_M_dataplus)._M_p;
      local_288 = (undefined1  [8])local_278;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_2a0 + 0x18),pcVar1,pcVar1 + psVar9->_M_string_length);
      local_2e8._0_8_ = (pointer)(local_2e8 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2e8,local_288,
                 (long)&(((_Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                           *)&psStack_280->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start +
                 (long)local_288);
      std::__cxx11::string::append(local_2e8);
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append(local_2e8,local_308._M_allocated_capacity);
      psVar9 = (string *)(puVar7 + 2);
      if ((string *)*puVar7 == psVar9) {
        local_328._16_8_ =
             (((_Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                *)&psVar9->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
        local_328._24_8_ = puVar7[3];
        local_328._0_8_ = (string *)(local_328 + 0x10);
      }
      else {
        local_328._16_8_ =
             (((_Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                *)&psVar9->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
        local_328._0_8_ = (string *)*puVar7;
      }
      local_328._8_8_ = puVar7[1];
      *puVar7 = psVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_308._M_local_buf,(string *)local_328);
      if ((string *)local_328._0_8_ != (string *)(local_328 + 0x10)) {
        operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
      }
      if ((pointer)local_2e8._0_8_ != (pointer)(local_2e8 + 0x10)) {
        operator_delete((void *)local_2e8._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_2e8._16_8_)->_M_p + 1));
      }
      if (local_288 != (undefined1  [8])local_278) {
        operator_delete((void *)local_288,(ulong)(local_278[0]._M_dataplus._M_p + 1));
      }
    }
    local_2e8._0_8_ = (pointer)0x0;
    local_2e8._8_8_ = (pointer)0x0;
    local_2e8._16_8_ = (pointer)0x0;
    this_00 = cmMakefile::GetGlobalGenerator(pcVar2->Makefile);
    iVar5 = std::__cxx11::string::compare
                      ((char *)(local_2c8->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar5 == 0) {
      iVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                       *)&this_00->ExportSets,&local_f0);
      p_Var15 = &(this_00->ExportSets).
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                 ._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)iVar12._M_node == p_Var15) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2a0 + 0x18));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_2a0 + 0x18),"Export set \"",0xc);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)(local_2a0 + 0x18),local_f0._M_dataplus._M_p,
                            local_f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" not found.",0xc);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar2,(string *)local_328);
        if ((string *)local_328._0_8_ != (string *)(local_328 + 0x10)) {
          operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_2a0 + 0x18));
        std::ios_base::~ios_base(local_218);
        exportSet = (cmExportSet *)0x0;
      }
      else {
        exportSet = *(cmExportSet **)(iVar12._M_node + 2);
      }
      if ((_Rb_tree_header *)iVar12._M_node == p_Var15) goto LAB_001b0850;
LAB_001b04ce:
      if (lVar3 == 0) {
        pcVar11 = (cmExportBuildFileGenerator *)operator_new(0x140);
        cmExportBuildFileGenerator::cmExportBuildFileGenerator(pcVar11);
      }
      else {
        pcVar11 = (cmExportBuildFileGenerator *)operator_new(0x140);
        cmExportBuildAndroidMKGenerator::cmExportBuildAndroidMKGenerator
                  ((cmExportBuildAndroidMKGenerator *)pcVar11);
      }
      cmExportFileGenerator::SetExportFile
                (&pcVar11->super_cmExportFileGenerator,(char *)local_308._M_allocated_capacity);
      std::__cxx11::string::_M_assign((string *)&(pcVar11->super_cmExportFileGenerator).Namespace);
      (pcVar11->super_cmExportFileGenerator).AppendMode = (bool)(char)local_58;
      if (exportSet == (cmExportSet *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&pcVar11->Targets,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2e8);
      }
      else {
        cmExportBuildFileGenerator::SetExportSet(pcVar11,exportSet);
      }
      cmMakefile::AddExportBuildFileGenerator(pcVar2->Makefile,pcVar11);
      (pcVar11->super_cmExportFileGenerator).ExportOld = local_58._1_1_;
      local_288 = (undefined1  [8])0x0;
      psStack_280 = (string *)0x0;
      local_278[0]._M_dataplus._M_p = (pointer)0x0;
      cmMakefile::GetConfigurations
                (&local_50,pcVar2->Makefile,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_2a0 + 0x18),true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      auVar14 = local_288;
      psVar9 = psStack_280;
      if (local_288 == (undefined1  [8])psStack_280) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_2a0 + 0x18));
        auVar14 = local_288;
        psVar9 = psStack_280;
      }
      for (; auVar14 != (undefined1  [8])psVar9; auVar14 = (undefined1  [8])((long)auVar14 + 0x20))
      {
        cmExportFileGenerator::AddConfiguration
                  (&pcVar11->super_cmExportFileGenerator,(string *)auVar14);
      }
      if (exportSet == (cmExportSet *)0x0) {
        cmGlobalGenerator::AddBuildExportSet(this_00,pcVar11);
      }
      else {
        cmGlobalGenerator::AddBuildExportExportSet(this_00,pcVar11);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2a0 + 0x18));
      bVar4 = true;
    }
    else if ((local_d0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_d0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) &&
            (_Var10 = std::
                      __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                                (local_2b8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 local_2b8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,"TARGETS"),
            _Var10._M_current ==
            local_2b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
      local_288 = (undefined1  [8])local_278;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_2a0 + 0x18),"EXPORT or TARGETS specifier missing.","");
      cmCommand::SetError(pcVar2,(string *)(local_2a0 + 0x18));
      _Var16._M_p = local_278[0]._M_dataplus._M_p;
      auVar14 = local_288;
      if (local_288 != (undefined1  [8])local_278) {
LAB_001b0848:
        operator_delete((void *)auVar14,(ulong)((long)&(((pointer)_Var16._M_p)->first)._M_len + 1));
      }
LAB_001b0850:
      bVar4 = false;
    }
    else {
      pbVar13 = local_d0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_d0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_d0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar17 = local_d0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar4 = cmMakefile::IsAlias(pcVar2->Makefile,pbVar17);
          if (bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2a0 + 0x18));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_2a0 + 0x18),"given ALIAS target \"",0x14);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)(local_2a0 + 0x18),(pbVar17->_M_dataplus)._M_p,
                                pbVar17->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\" which may not be exported.",0x1c);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(pcVar2,(string *)local_328);
LAB_001b0758:
            if ((string *)local_328._0_8_ != (string *)(local_328 + 0x10)) {
              operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_2a0 + 0x18));
            std::ios_base::~ios_base(local_218);
            goto LAB_001b0850;
          }
          this_01 = cmGlobalGenerator::FindTarget(this_00,pbVar17,false);
          if (this_01 == (cmTarget *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2a0 + 0x18));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_2a0 + 0x18),"given target \"",0xe);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)(local_2a0 + 0x18),(pbVar17->_M_dataplus)._M_p,
                                pbVar17->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\" which is not built by this project.",0x25);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(pcVar2,(string *)local_328);
            goto LAB_001b0758;
          }
          TVar6 = cmTarget::GetType(this_01);
          if (TVar6 == UTILITY) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_328,"given custom target \"",pbVar17);
            puVar7 = (undefined8 *)std::__cxx11::string::append(local_328);
            psVar9 = (string *)(puVar7 + 2);
            if ((string *)*puVar7 == psVar9) {
              local_278[0]._M_dataplus._M_p =
                   (pointer)(((_Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                               *)&psVar9->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
              local_278[0]._M_string_length = puVar7[3];
              local_288 = (undefined1  [8])local_278;
            }
            else {
              local_278[0]._M_dataplus._M_p =
                   (pointer)(((_Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                               *)&psVar9->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
              local_288 = (undefined1  [8])*puVar7;
            }
            psStack_280 = (string *)puVar7[1];
            *puVar7 = psVar9;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            cmCommand::SetError(pcVar2,(string *)(local_2a0 + 0x18));
            if (local_288 != (undefined1  [8])local_278) {
              operator_delete((void *)local_288,(ulong)(local_278[0]._M_dataplus._M_p + 1));
            }
            _Var16._M_p = (pointer)local_328._16_8_;
            auVar14 = (undefined1  [8])local_328._0_8_;
            if ((string *)local_328._0_8_ == (string *)(local_328 + 0x10)) goto LAB_001b0850;
            goto LAB_001b0848;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2e8,pbVar17);
          pbVar17 = pbVar17 + 1;
        } while (pbVar17 != pbVar13);
      }
      if (((char)local_58 != '\x01') ||
         (pcVar11 = cmGlobalGenerator::GetExportedTargetsFile(this_00,(string *)&local_308),
         pcVar11 == (cmExportBuildFileGenerator *)0x0)) {
        exportSet = (cmExportSet *)0x0;
        goto LAB_001b04ce;
      }
      bVar4 = true;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &pcVar11->Targets,
                 (pcVar11->Targets).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,local_2e8._0_8_,local_2e8._8_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_allocated_capacity != &local_2f8) {
    operator_delete((void *)local_308._M_allocated_capacity,
                    CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1);
  }
LAB_001b0878:
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
             *)local_2a0);
  return bVar4;
}

Assistant:

bool cmExportCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with too few arguments");
    return false;
  }

  if (args[0] == "PACKAGE") {
    return this->HandlePackage(args);
  }

  struct Arguments
  {
    std::string ExportSetName;
    std::vector<std::string> Targets;
    std::string Namespace;
    std::string Filename;
    std::string AndroidMKFile;
    bool Append = false;
    bool ExportOld = false;
  };

  auto parser = cmArgumentParser<Arguments>{}
                  .Bind("NAMESPACE"_s, &Arguments::Namespace)
                  .Bind("FILE"_s, &Arguments::Filename);

  if (args[0] == "EXPORT") {
    parser.Bind("EXPORT"_s, &Arguments::ExportSetName);
  } else {
    parser.Bind("TARGETS"_s, &Arguments::Targets);
    parser.Bind("ANDROID_MK"_s, &Arguments::AndroidMKFile);
    parser.Bind("APPEND"_s, &Arguments::Append);
    parser.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, &Arguments::ExportOld);
  }

  std::vector<std::string> unknownArgs;
  std::vector<std::string> keywordsMissingValue;
  Arguments const arguments =
    parser.Parse(args, &unknownArgs, &keywordsMissingValue);

  if (!unknownArgs.empty()) {
    this->SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
    return false;
  }

  std::string fname;
  bool android = false;
  if (!arguments.AndroidMKFile.empty()) {
    fname = arguments.AndroidMKFile;
    android = true;
  }
  if (arguments.Filename.empty() && fname.empty()) {
    if (args[0] != "EXPORT") {
      this->SetError("FILE <filename> option missing.");
      return false;
    }
    fname = arguments.ExportSetName + ".cmake";
  } else if (fname.empty()) {
    // Make sure the file has a .cmake extension.
    if (cmSystemTools::GetFilenameLastExtension(arguments.Filename) !=
        ".cmake") {
      std::ostringstream e;
      e << "FILE option given filename \"" << arguments.Filename
        << "\" which does not have an extension of \".cmake\".\n";
      this->SetError(e.str());
      return false;
    }
    fname = arguments.Filename;
  }

  // Get the file to write.
  if (cmSystemTools::FileIsFullPath(fname)) {
    if (!this->Makefile->CanIWriteThisFile(fname)) {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      this->SetError(e.str());
      return false;
    }
  } else {
    // Interpret relative paths with respect to the current build dir.
    std::string dir = this->Makefile->GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
  }

  std::vector<std::string> targets;

  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();

  cmExportSet* ExportSet = nullptr;
  if (args[0] == "EXPORT") {
    cmExportSetMap& setMap = gg->GetExportSets();
    auto const it = setMap.find(arguments.ExportSetName);
    if (it == setMap.end()) {
      std::ostringstream e;
      e << "Export set \"" << arguments.ExportSetName << "\" not found.";
      this->SetError(e.str());
      return false;
    }
    ExportSet = it->second;
  } else if (!arguments.Targets.empty() ||
             std::find(keywordsMissingValue.begin(),
                       keywordsMissingValue.end(),
                       "TARGETS") != keywordsMissingValue.end()) {
    for (std::string const& currentTarget : arguments.Targets) {
      if (this->Makefile->IsAlias(currentTarget)) {
        std::ostringstream e;
        e << "given ALIAS target \"" << currentTarget
          << "\" which may not be exported.";
        this->SetError(e.str());
        return false;
      }

      if (cmTarget* target = gg->FindTarget(currentTarget)) {
        if (target->GetType() == cmStateEnums::UTILITY) {
          this->SetError("given custom target \"" + currentTarget +
                         "\" which may not be exported.");
          return false;
        }
      } else {
        std::ostringstream e;
        e << "given target \"" << currentTarget
          << "\" which is not built by this project.";
        this->SetError(e.str());
        return false;
      }
      targets.push_back(currentTarget);
    }
    if (arguments.Append) {
      if (cmExportBuildFileGenerator* ebfg =
            gg->GetExportedTargetsFile(fname)) {
        ebfg->AppendTargets(targets);
        return true;
      }
    }
  } else {
    this->SetError("EXPORT or TARGETS specifier missing.");
    return false;
  }

  // Setup export file generation.
  cmExportBuildFileGenerator* ebfg = nullptr;
  if (android) {
    ebfg = new cmExportBuildAndroidMKGenerator;
  } else {
    ebfg = new cmExportBuildFileGenerator;
  }
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(arguments.Namespace);
  ebfg->SetAppendMode(arguments.Append);
  if (ExportSet != nullptr) {
    ebfg->SetExportSet(ExportSet);
  } else {
    ebfg->SetTargets(targets);
  }
  this->Makefile->AddExportBuildFileGenerator(ebfg);
  ebfg->SetExportOld(arguments.ExportOld);

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes;
  this->Makefile->GetConfigurations(configurationTypes);
  if (configurationTypes.empty()) {
    configurationTypes.emplace_back();
  }
  for (std::string const& ct : configurationTypes) {
    ebfg->AddConfiguration(ct);
  }
  if (ExportSet != nullptr) {
    gg->AddBuildExportExportSet(ebfg);
  } else {
    gg->AddBuildExportSet(ebfg);
  }

  return true;
}